

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

void __thiscall ON_Extrusion::Destroy(ON_Extrusion *this)

{
  ON_Extrusion *this_local;
  
  if (this->m_profile != (ON_Curve *)0x0) {
    if (this->m_profile != (ON_Curve *)0x0) {
      (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    this->m_profile = (ON_Curve *)0x0;
  }
  ON_ExtrusionInitializeHelper(this);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  ON_Object::PurgeUserData((ON_Object *)this);
  return;
}

Assistant:

void ON_Extrusion::Destroy()
{
  if ( m_profile)
  {
    delete m_profile;
    m_profile = 0;
  }
  ON_ExtrusionInitializeHelper(*this);
  DestroyRuntimeCache();
  PurgeUserData();
}